

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::builtins::RealMath1Function<&sinh>::eval
          (ConstantValue *__return_storage_ptr__,RealMath1Function<&sinh> *this,EvalContext *context
          ,Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  __index_type _Var1;
  variant_alternative_t<2UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar2;
  double dVar3;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_38;
  
  Expression::eval((ConstantValue *)&_Stack_38,*args->_M_ptr,context);
  if (_Stack_38._M_index == '\0') {
    _Var1 = '\0';
  }
  else {
    pvVar2 = std::
             get<2ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&_Stack_38);
    dVar3 = sinh(pvVar2->v);
    *(double *)
     &(__return_storage_ptr__->value).
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         = dVar3;
    _Var1 = '\x02';
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = _Var1;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        ConstantValue v = args[0]->eval(context);
        if (!v)
            return nullptr;

        double result = Func(v.real());
        return real_t(result);
    }